

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::StreamWideCharsToMessage(wchar_t *wstr,size_t length,Message *msg)

{
  Message *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar1;
  size_t i;
  int in_stack_00000174;
  wchar_t *in_stack_00000178;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  Message *in_stack_ffffffffffffffa0;
  string local_40 [32];
  long local_20;
  Message *local_18;
  long local_10;
  long local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_20 != local_10) {
    if (*(int *)(local_8 + local_20 * 4) == 0) {
      Message::operator<<(in_stack_ffffffffffffffa0,
                          (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      local_20 = local_20 + 1;
    }
    else {
      in_stack_ffffffffffffffa0 = local_18;
      WideStringToUtf8_abi_cxx11_(in_stack_00000178,in_stack_00000174);
      Message::operator<<(in_stack_ffffffffffffffa0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      std::__cxx11::string::~string(local_40);
      while( true ) {
        bVar1 = false;
        if (local_20 != local_10) {
          bVar1 = *(int *)(local_8 + local_20 * 4) != 0;
        }
        if (!bVar1) break;
        local_20 = local_20 + 1;
      }
      in_stack_ffffffffffffff9f = 0;
    }
  }
  return;
}

Assistant:

static void StreamWideCharsToMessage(const wchar_t* wstr, size_t length,
                                     Message* msg) {
  for (size_t i = 0; i != length; ) {  // NOLINT
    if (wstr[i] != L'\0') {
      *msg << WideStringToUtf8(wstr + i, static_cast<int>(length - i));
      while (i != length && wstr[i] != L'\0')
        i++;
    } else {
      *msg << '\0';
      i++;
    }
  }
}